

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_string(lua_State *L)

{
  CTState *cts;
  uint64_t uVar1;
  int32_t iVar2;
  TValue *o;
  GCstr *pGVar3;
  size_t lenx;
  TValue *pTVar4;
  char *p;
  char *local_30;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  o = lj_lib_checkany(L,1);
  pTVar4 = o + 1;
  if ((pTVar4 < L->top) && (pTVar4->u64 != 0xffffffffffffffff)) {
    iVar2 = ffi_checkint(L,2);
    lenx = (size_t)iVar2;
    lj_cconv_ct_tv(cts,cts->tab + 0x12,(uint8_t *)&local_30,o,0x100);
  }
  else {
    lj_cconv_ct_tv(cts,cts->tab + 0x13,(uint8_t *)&local_30,o,0x100);
    lenx = strlen(local_30);
  }
  L->top = pTVar4;
  pGVar3 = lj_str_new(L,local_30,lenx);
  o->u64 = (ulong)pGVar3 | 0xfffd800000000000;
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_string)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  TValue *o = lj_lib_checkany(L, 1);
  const char *p;
  size_t len;
  if (o+1 < L->top && !tvisnil(o+1)) {
    len = (size_t)ffi_checkint(L, 2);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p, o,
		   CCF_ARG(1));
  } else {
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CCHAR), (uint8_t *)&p, o,
		   CCF_ARG(1));
    len = strlen(p);
  }
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  setstrV(L, o, lj_str_new(L, p, len));
  lj_gc_check(L);
  return 1;
}